

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

void dg::llvmdg::LLVMSlicer::adjustPhiNodes(BasicBlock *pred,BasicBlock *blk)

{
  int iVar1;
  BasicBlock *pBVar2;
  
  for (pBVar2 = pred + 0x30;
      ((pBVar2 = *(BasicBlock **)pBVar2, pBVar2 != pred + 0x28 && (pBVar2 != (BasicBlock *)0x0)) &&
      (pBVar2[-8] == (BasicBlock)0x52)); pBVar2 = pBVar2 + 8) {
    iVar1 = llvm::PHINode::getBasicBlockIndex((PHINode *)(pBVar2 + -0x18),blk);
    if (-1 < iVar1) {
      llvm::PHINode::removeIncomingValue((uint)(PHINode *)(pBVar2 + -0x18),SUB41(iVar1,0));
    }
  }
  return;
}

Assistant:

static void adjustPhiNodes(llvm::BasicBlock *pred, llvm::BasicBlock *blk) {
        using namespace llvm;

        for (Instruction &I : *pred) {
            PHINode *phi = dyn_cast<PHINode>(&I);
            if (phi) {
                // don't try remove block that we already removed
                int idx = phi->getBasicBlockIndex(blk);
                if (idx < 0)
                    continue;

                // the second argument is DeletePHIIFEmpty.
                // We don't want that, since that would make
                // dependence graph inconsistent. We'll
                // slice it away later, if it's empty
                phi->removeIncomingValue(idx, false);
            } else {
                // phi nodes are always at the beginning of the block
                // so if this is the first value that is not PHI,
                // there won't be any other and we can bail out
                break;
            }
        }
    }